

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cc
# Opt level: O3

void ipx::dump<std::__cxx11::string>
               (ostream *os,char *name,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  long *plVar1;
  ostream *poVar2;
  long *plVar3;
  char local_89;
  long *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  long local_78;
  long lStack_70;
  string local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"info.","");
  plVar1 = (long *)std::__cxx11::string::append((char *)local_48);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_78 = *plVar3;
    lStack_70 = plVar1[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar3;
    local_88 = (long *)*plVar1;
  }
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  Textline<std::__cxx11::string>(&local_68,(ipx *)&local_88,local_80);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_68._M_dataplus._M_p,local_68._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(value->_M_dataplus)._M_p,value->_M_string_length);
  local_89 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_89,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return;
}

Assistant:

static void dump(std::ostream& os, const char* name, T value) {
    os << Textline(std::string("info.")+name) << value << '\n';
}